

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O2

Hop_Obj_t * Hop_Miter(Hop_Man_t *p,Vec_Ptr_t *vPairs)

{
  uint uVar1;
  Hop_Obj_t *pHVar2;
  long lVar3;
  
  uVar1 = vPairs->nSize;
  if ((int)uVar1 < 1) {
    __assert_fail("vPairs->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopOper.c"
                  ,300,"Hop_Obj_t *Hop_Miter(Hop_Man_t *, Vec_Ptr_t *)");
  }
  if ((uVar1 & 1) == 0) {
    for (lVar3 = 0; lVar3 < (int)uVar1; lVar3 = lVar3 + 2) {
      pHVar2 = Hop_Exor(p,(Hop_Obj_t *)vPairs->pArray[lVar3],(Hop_Obj_t *)vPairs->pArray[lVar3 + 1])
      ;
      *(ulong *)((long)vPairs->pArray + lVar3 * 4) = (ulong)pHVar2 ^ 1;
      uVar1 = vPairs->nSize;
    }
    vPairs->nSize = (int)uVar1 / 2;
    pHVar2 = Hop_Multi_rec(p,(Hop_Obj_t **)vPairs->pArray,(int)uVar1 / 2,AIG_AND);
    return (Hop_Obj_t *)((ulong)pHVar2 ^ 1);
  }
  __assert_fail("vPairs->nSize % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopOper.c"
                ,0x12d,"Hop_Obj_t *Hop_Miter(Hop_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Hop_Obj_t * Hop_Miter( Hop_Man_t * p, Vec_Ptr_t * vPairs )
{
    int i;
    assert( vPairs->nSize > 0 );
    assert( vPairs->nSize % 2 == 0 );
    // go through the cubes of the node's SOP
    for ( i = 0; i < vPairs->nSize; i += 2 )
        vPairs->pArray[i/2] = Hop_Not( Hop_Exor( p, (Hop_Obj_t *)vPairs->pArray[i], (Hop_Obj_t *)vPairs->pArray[i+1] ) );
    vPairs->nSize = vPairs->nSize/2;
    return Hop_Not( Hop_Multi_rec( p, (Hop_Obj_t **)vPairs->pArray, vPairs->nSize, AIG_AND ) );
}